

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

int mp_check(char **data,char *end)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  char *pcVar4;
  byte *pbVar5;
  bool bVar6;
  int iVar7;
  byte *pbVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  mp_check_error err;
  byte local_61;
  mp_check_error local_60;
  
  pcVar4 = *data;
  lVar11 = 1;
  do {
    pbVar5 = (byte *)*data;
    if (pbVar5 == (byte *)end) {
LAB_00134c63:
      local_60.type = MP_CHECK_ERROR_TRUNC;
      local_60.data = pcVar4;
      local_60.end = end;
      local_60.pos = (char *)pbVar5;
      local_60.trunc_count = lVar11;
      (*mp_check_on_error)(&local_60);
      bVar6 = true;
    }
    else {
      bVar1 = *pbVar5;
      pbVar8 = pbVar5 + 1;
      *data = (char *)pbVar8;
      cVar2 = ""[bVar1];
      uVar10 = (uint)cVar2;
      if (-1 < cVar2) {
        if ((ulong)((long)end - (long)pbVar8) < (ulong)uVar10) goto LAB_00134c63;
        if ((byte)(bVar1 + 0x2c) < 5) {
          uVar10 = uVar10 - 1;
          bVar1 = pbVar5[1];
          *data = (char *)(pbVar5 + 2);
          iVar7 = (*mp_check_ext_data)(bVar1,(char *)(pbVar5 + 2),uVar10);
          if (iVar7 != 0) {
            local_60.type = MP_CHECK_ERROR_EXT;
            local_60.pos = *data;
            local_60.ext_type = bVar1;
            local_60.ext_len = uVar10;
            goto LAB_00134cea;
          }
          pbVar8 = (byte *)(*data + uVar10);
        }
        else {
          pbVar8 = pbVar8 + uVar10;
        }
        *data = (char *)pbVar8;
LAB_00134c43:
        bVar6 = false;
        goto LAB_00134c48;
      }
      if (-0x20 < cVar2) {
        lVar11 = lVar11 - (int)uVar10;
        goto LAB_00134c43;
      }
      switch(cVar2) {
      case -0x2a:
        local_60.type = MP_CHECK_ERROR_ILL;
        local_60.pos = (char *)pbVar5;
        goto LAB_00134cea;
      case -0x29:
        if (4 < (ulong)((long)end - (long)pbVar8)) {
          uVar10 = *(uint *)(pbVar5 + 1);
          uVar9 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                         uVar10 << 0x18);
          *data = (char *)(pbVar5 + 5);
          local_61 = pbVar5[5];
          pbVar8 = pbVar5 + 6;
LAB_00134dd4:
          *data = (char *)pbVar8;
          if (uVar9 <= (ulong)((long)end - (long)pbVar8)) {
            iVar7 = (*mp_check_ext_data)(local_61,(char *)pbVar8,(uint32_t)uVar9);
            if (iVar7 == 0) {
              *data = *data + uVar9;
              goto LAB_00134f27;
            }
            local_60.type = MP_CHECK_ERROR_EXT;
            local_60.ext_type = local_61;
            local_60.pos = *data;
            local_60.ext_len = (uint32_t)uVar9;
            goto LAB_00134cea;
          }
        }
        break;
      case -0x28:
        if (2 < (ulong)((long)end - (long)pbVar8)) {
          uVar3 = *(ushort *)(pbVar5 + 1);
          *data = (char *)(pbVar5 + 3);
          uVar9 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
          local_61 = pbVar5[3];
          pbVar8 = pbVar5 + 4;
          goto LAB_00134dd4;
        }
        break;
      case -0x27:
        if (1 < (ulong)((long)end - (long)pbVar8)) {
          uVar9 = (ulong)pbVar5[1];
          *data = (char *)(pbVar5 + 2);
          local_61 = pbVar5[2];
          pbVar8 = pbVar5 + 3;
          goto LAB_00134dd4;
        }
        break;
      case -0x26:
        if (3 < (ulong)((long)end - (long)pbVar8)) {
          uVar10 = *(uint *)(pbVar5 + 1);
          uVar9 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                         uVar10 << 0x18);
          *data = (char *)(pbVar5 + 5);
LAB_00134e70:
          lVar11 = lVar11 + uVar9 * 2;
LAB_00134f27:
          bVar6 = false;
          goto LAB_00134c48;
        }
        break;
      case -0x25:
        if (1 < (ulong)((long)end - (long)pbVar8)) {
          uVar3 = *(ushort *)(pbVar5 + 1);
          *data = (char *)(pbVar5 + 3);
          uVar9 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
          goto LAB_00134e70;
        }
        break;
      case -0x24:
        if (3 < (ulong)((long)end - (long)pbVar8)) {
          uVar10 = *(uint *)(pbVar5 + 1);
          uVar9 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                         uVar10 << 0x18);
          *data = (char *)(pbVar5 + 5);
LAB_00134eea:
          lVar11 = lVar11 + uVar9;
          goto LAB_00134f27;
        }
        break;
      case -0x23:
        if (1 < (ulong)((long)end - (long)pbVar8)) {
          uVar3 = *(ushort *)(pbVar5 + 1);
          *data = (char *)(pbVar5 + 3);
          uVar9 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
          goto LAB_00134eea;
        }
        break;
      case -0x22:
        if (3 < (ulong)((long)end - (long)pbVar8)) {
          uVar10 = *(uint *)(pbVar5 + 1);
          uVar9 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                         uVar10 << 0x18);
          pbVar8 = pbVar5 + 5;
LAB_00134f13:
          *data = (char *)pbVar8;
          if (uVar9 <= (ulong)((long)end - (long)pbVar8)) {
            *data = (char *)(pbVar8 + uVar9);
            goto LAB_00134f27;
          }
        }
        break;
      case -0x21:
        if (1 < (ulong)((long)end - (long)pbVar8)) {
          uVar3 = *(ushort *)(pbVar5 + 1);
          pbVar8 = pbVar5 + 3;
          *data = (char *)pbVar8;
          uVar9 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
          if (uVar9 <= (ulong)((long)end - (long)pbVar8)) {
            *data = (char *)(pbVar8 + uVar9);
            goto LAB_00134f27;
          }
        }
        break;
      case -0x20:
        if (pbVar8 != (byte *)end) {
          uVar9 = (ulong)pbVar5[1];
          pbVar8 = pbVar5 + 2;
          goto LAB_00134f13;
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                      ,0xd31,"int mp_check(const char **, const char *)");
      }
      local_60.type = MP_CHECK_ERROR_TRUNC;
      local_60.pos = (char *)pbVar5;
      local_60.trunc_count = lVar11;
LAB_00134cea:
      local_60.data = pcVar4;
      local_60.end = end;
      (*mp_check_on_error)(&local_60);
      bVar6 = true;
    }
LAB_00134c48:
    if (bVar6) {
      return 1;
    }
    bVar6 = lVar11 < 2;
    lVar11 = lVar11 + -1;
    if (bVar6) {
      if (*data <= end) {
        return 0;
      }
      __assert_fail("*data <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xd35,"int mp_check(const char **, const char *)");
    }
  } while( true );
}

Assistant:

MP_IMPL int
mp_check(const char **data, const char *end)
{
	const char *begin = *data;

#define MP_CHECK_LEN(_l)						\
	if (mp_unlikely((size_t)(end - *data) < (size_t)(_l))) {	\
		struct mp_check_error err;				\
		err.type = MP_CHECK_ERROR_TRUNC;			\
		err.data = begin;					\
		err.end = end;						\
		err.pos = pos;						\
		err.trunc_count = k;					\
		mp_check_on_error(&err);				\
		return 1;						\
	}

#define MP_CHECK_EXT(_type, _data, _len)				\
	if (mp_check_ext_data((_type), (_data), (_len)) != 0) {		\
		struct mp_check_error err;				\
		err.type = MP_CHECK_ERROR_EXT;				\
		err.data = begin;					\
		err.end = end;						\
		err.pos = (_data);					\
		err.ext_type = (_type);					\
		err.ext_len = (_len);					\
		mp_check_on_error(&err);				\
		return 1;						\
	}

	int64_t k;
	for (k = 1; k > 0; k--) {
		const char *pos = *data;
		MP_CHECK_LEN(1);
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		uint32_t len;
		int8_t type;
		if (mp_likely(l >= 0)) {
			MP_CHECK_LEN(l);
			if (mp_unlikely(c >= 0xd4 && c <= 0xd8)) {
				/*
				 * Check MP_EXT contents. Everything but the
				 * first byte (which stands for ext type) is the
				 * payload.
				 */
				len = l - 1;
				type = mp_load_u8(data);
				MP_CHECK_EXT(type, *data, len);
				*data += len;
			} else {
				*data += l;
			}
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			MP_CHECK_LEN(sizeof(uint8_t));
			len = mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			len = mp_load_u16(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			MP_CHECK_LEN(sizeof(uint32_t))
			len = mp_load_u32(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += 2 * (uint32_t)mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += 2 * (uint64_t)mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			MP_CHECK_LEN(sizeof(uint8_t) + sizeof(uint8_t));
			len = mp_load_u8(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			MP_CHECK_LEN(sizeof(uint16_t) + sizeof(uint8_t));
			len = mp_load_u16(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			MP_CHECK_LEN(sizeof(uint32_t) + sizeof(uint8_t));
			len = mp_load_u32(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_INVALID:
		{
			struct mp_check_error err;
			err.type = MP_CHECK_ERROR_ILL;
			err.data = begin;
			err.end = end;
			err.pos = pos;
			mp_check_on_error(&err);
			return 1;
		}
		default:
			mp_unreachable();
		}
	}

	assert(*data <= end);
#undef MP_CHECK_LEN
#undef MP_CHECK_EXT
	return 0;
}